

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::EnhancedLayouts::TextureTestBase::getShaderSource_abi_cxx11_
          (string *__return_storage_ptr__,TextureTestBase *this,GLuint test_case_index,
          ProgramInterface *program_interface,VaryingPassthrough *varying_passthrough,STAGES stage)

{
  string *__s;
  uint uVar1;
  GLchar *pGVar2;
  ulong uVar3;
  size_t local_e0;
  size_t position;
  char *local_d0;
  GLchar *per_vertex;
  GLchar **local_a8;
  string *passthrough;
  string local_90 [32];
  string *local_70;
  string *verification;
  string *local_48;
  string *shader_interface;
  GLchar *shader_template;
  VaryingPassthrough *pVStack_30;
  STAGES stage_local;
  VaryingPassthrough *varying_passthrough_local;
  ProgramInterface *program_interface_local;
  TextureTestBase *pTStack_18;
  GLuint test_case_index_local;
  TextureTestBase *this_local;
  string *source;
  
  shader_template._4_4_ = stage;
  pVStack_30 = varying_passthrough;
  varying_passthrough_local = (VaryingPassthrough *)program_interface;
  program_interface_local._4_4_ = test_case_index;
  pTStack_18 = this;
  this_local = (TextureTestBase *)__return_storage_ptr__;
  shader_interface = (string *)getShaderTemplate(this,stage);
  Utils::ProgramInterface::GetInterfaceForStage_abi_cxx11_
            ((string *)&verification,(ProgramInterface *)varying_passthrough_local,
             shader_template._4_4_);
  local_48 = (string *)&verification;
  (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xe])
            (local_90,this,(ulong)program_interface_local._4_4_,varying_passthrough_local,
             (ulong)shader_template._4_4_);
  local_70 = local_90;
  (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xd])
            (&per_vertex,this,(ulong)program_interface_local._4_4_,pVStack_30,
             (ulong)shader_template._4_4_);
  __s = shader_interface;
  local_a8 = &per_vertex;
  local_d0 = "";
  position._7_1_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)__s,(allocator<char> *)((long)&position + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&position + 6));
  local_e0 = 0;
  if (shader_template._4_4_ == GEOMETRY) {
    uVar1 = (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
              [0x20])(this,(ulong)program_interface_local._4_4_);
    if ((uVar1 & 1) == 0) {
      local_d0 = "out gl_PerVertex {\nvec4 gl_Position;\n};\n\n";
    }
    Utils::replaceToken("PERVERTEX",&local_e0,local_d0,__return_storage_ptr__);
  }
  pGVar2 = (GLchar *)std::__cxx11::string::c_str();
  Utils::replaceToken("INTERFACE",&local_e0,pGVar2,__return_storage_ptr__);
  pGVar2 = (GLchar *)std::__cxx11::string::c_str();
  Utils::replaceToken("VERIFICATION",&local_e0,pGVar2,__return_storage_ptr__);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    Utils::replaceAllTokens("ELSE","    else ",__return_storage_ptr__);
  }
  else {
    Utils::replaceAllTokens("ELSE","",__return_storage_ptr__);
  }
  pGVar2 = (GLchar *)std::__cxx11::string::c_str();
  Utils::replaceAllTokens("PASSTHROUGH",pGVar2,__return_storage_ptr__);
  position._7_1_ = 1;
  std::__cxx11::string::~string((string *)&per_vertex);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)&verification);
  return __return_storage_ptr__;
}

Assistant:

std::string TextureTestBase::getShaderSource(GLuint test_case_index, Utils::ProgramInterface& program_interface,
											 Utils::VaryingPassthrough& varying_passthrough,
											 Utils::Shader::STAGES		stage)
{
	/* Get strings */
	const GLchar*	  shader_template  = getShaderTemplate(stage);
	const std::string& shader_interface = program_interface.GetInterfaceForStage(stage);

	const std::string& verification = getVerificationSnippet(test_case_index, program_interface, stage);

	const std::string& passthrough = getPassSnippet(test_case_index, varying_passthrough, stage);

	const GLchar* per_vertex = "";

	std::string source   = shader_template;
	size_t		position = 0;

	/* Replace tokens in template */
	if (Utils::Shader::GEOMETRY == stage)
	{
		if (false == useMonolithicProgram(test_case_index))
		{
			per_vertex = "out gl_PerVertex {\n"
						 "vec4 gl_Position;\n"
						 "};\n"
						 "\n";
		}

		Utils::replaceToken("PERVERTEX", position, per_vertex, source);
	}

	Utils::replaceToken("INTERFACE", position, shader_interface.c_str(), source);
	Utils::replaceToken("VERIFICATION", position, verification.c_str(), source);

	if (false == verification.empty())
	{
		Utils::replaceAllTokens("ELSE", "    else ", source);
	}
	else
	{
		Utils::replaceAllTokens("ELSE", "", source);
	}

	Utils::replaceAllTokens("PASSTHROUGH", passthrough.c_str(), source);

	/* Done */
	return source;
}